

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O3

bool BaseFile_Open(TFileStream *pStream,TCHAR *szFileName,DWORD dwStreamFlags)

{
  int __fd;
  int iVar1;
  DWORD *pDVar2;
  stat64 fileinfo;
  stat64 local_a0;
  
  (pStream->Base).File.hFile = (HANDLE)0xffffffffffffffff;
  __fd = open(szFileName,~dwStreamFlags >> 7 & 2);
  if (__fd == -1) {
    pDVar2 = (DWORD *)__errno_location();
    SetLastError(*pDVar2);
  }
  else {
    iVar1 = fstat64(__fd,&local_a0);
    if (iVar1 != -1) {
      (pStream->Base).File.FileTime = local_a0.st_mtim.tv_sec * 10000000 + 0x19db1ded53e8000;
      (pStream->Base).File.FileSize = local_a0.st_size;
      *(long *)((long)&pStream->Base + 0x18) = (long)__fd;
      (pStream->Base).File.FilePos = 0;
      return true;
    }
    pDVar2 = (DWORD *)__errno_location();
    SetLastError(*pDVar2);
    close(__fd);
  }
  return false;
}

Assistant:

static bool BaseFile_Open(TFileStream * pStream, const TCHAR * szFileName, DWORD dwStreamFlags)
{
#ifdef PLATFORM_WINDOWS
    {
        ULARGE_INTEGER FileSize;
        DWORD dwWriteAccess = (dwStreamFlags & STREAM_FLAG_READ_ONLY) ? 0 : FILE_WRITE_DATA | FILE_APPEND_DATA | FILE_WRITE_ATTRIBUTES;
        DWORD dwWriteShare = (dwStreamFlags & STREAM_FLAG_WRITE_SHARE) ? FILE_SHARE_WRITE : 0;

        // Open the file
        pStream->Base.File.hFile = CreateFile(szFileName,
                                              FILE_READ_DATA | FILE_READ_ATTRIBUTES | dwWriteAccess,
                                              FILE_SHARE_READ | dwWriteShare,
                                              NULL,
                                              OPEN_EXISTING,
                                              0,
                                              NULL);
        if(pStream->Base.File.hFile == INVALID_HANDLE_VALUE)
            return false;

        // Query the file size
        FileSize.LowPart = GetFileSize(pStream->Base.File.hFile, &FileSize.HighPart);
        pStream->Base.File.FileSize = FileSize.QuadPart;

        // Query last write time
        GetFileTime(pStream->Base.File.hFile, NULL, NULL, (LPFILETIME)&pStream->Base.File.FileTime);
    }
#endif

#if defined(PLATFORM_MAC) || defined(PLATFORM_LINUX)
    {
        struct stat64 fileinfo;
        int oflag = (dwStreamFlags & STREAM_FLAG_READ_ONLY) ? O_RDONLY : O_RDWR;
        intptr_t handle;

        // Open the file
        pStream->Base.File.hFile = INVALID_HANDLE_VALUE;
        handle = open(szFileName, oflag | O_LARGEFILE);
        if(handle == -1)
        {
            SetLastError(errno);
            return false;
        }

        // Get the file size
        if(fstat64(handle, &fileinfo) == -1)
        {
            SetLastError(errno);
            close(handle);
            return false;
        }

        // time_t is number of seconds since 1.1.1970, UTC.
        // 1 second = 10000000 (decimal) in FILETIME
        // Set the start to 1.1.1970 00:00:00
        pStream->Base.File.FileTime = 0x019DB1DED53E8000ULL + (10000000 * fileinfo.st_mtime);
        pStream->Base.File.FileSize = (ULONGLONG)fileinfo.st_size;
        pStream->Base.File.hFile = (HANDLE)handle;
    }
#endif

    // Reset the file position
    pStream->Base.File.FilePos = 0;
    return true;
}